

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts_p.h
# Opt level: O0

bool __thiscall QHstsCache::HostName::operator<(HostName *this,HostName *rhs)

{
  long lVar1;
  qsizetype qVar2;
  QStringView *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  QStringView *in_stack_ffffffffffffffb0;
  QStringView *lhs;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QStringView::size((QStringView *)(in_RDI + 1));
  if (qVar2 == 0) {
    qVar2 = QStringView::size((QStringView *)&in_RSI[1].m_data);
    if (qVar2 == 0) {
      local_29 = ::operator<((QString *)in_stack_ffffffffffffffb0,
                             (QString *)
                             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    }
    else {
      QStringView::QStringView<QString,_true>(in_RSI,in_RDI);
      local_29 = ::operator<(in_stack_ffffffffffffffb0,
                             (QStringView *)
                             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    }
  }
  else {
    qVar2 = QStringView::size((QStringView *)&in_RSI[1].m_data);
    if (qVar2 == 0) {
      lhs = (QStringView *)(in_RDI + 1);
      QStringView::QStringView<QString,_true>(in_RSI,in_RDI);
      local_29 = ::operator<(lhs,(QStringView *)
                                 CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    }
    else {
      local_29 = ::operator<(in_stack_ffffffffffffffb0,
                             (QStringView *)
                             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool operator < (const HostName &rhs) const
        {
            if (fragment.size()) {
                if (rhs.fragment.size())
                    return fragment < rhs.fragment;
                return fragment < QStringView{rhs.name};
            }

            if (rhs.fragment.size())
                return QStringView{name} < rhs.fragment;
            return name < rhs.name;
        }